

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-blend.c
# Opt level: O3

void composition_solid_clear(uint32_t *dest,int length,uint32_t color,uint32_t const_alpha)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  if (const_alpha == 0xff) {
    plutovg_memfill32(dest,length,0);
    return;
  }
  if (0 < length) {
    uVar1 = 0;
    do {
      uVar3 = (dest[uVar1] & 0xff00ff) * (0xff - const_alpha);
      uVar2 = (dest[uVar1] >> 8 & 0xff00ff) * (0xff - const_alpha);
      dest[uVar1] = uVar2 + 0x800080 + (uVar2 >> 8 & 0xff00ff) & 0xff00ff00 |
                    uVar3 + 0x800080 + (uVar3 >> 8 & 0xff00ff) >> 8 & 0xff00ff;
      uVar1 = uVar1 + 1;
    } while ((uint)length != uVar1);
  }
  return;
}

Assistant:

static void composition_solid_clear(uint32_t* dest, int length, uint32_t color, uint32_t const_alpha)
{
    if(const_alpha == 255) {
        plutovg_memfill32(dest, length, 0);
    } else {
        uint32_t ialpha = 255 - const_alpha;
        for(int i = 0; i < length; i++) {
            dest[i] = BYTE_MUL(dest[i], ialpha);
        }
    }
}